

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLinearSumBounds.h
# Opt level: O0

void __thiscall HighsLinearSumBounds::setNumSums(HighsLinearSumBounds *this,HighsInt numSums)

{
  undefined4 in_stack_00000008;
  
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)this,CONCAT44(numSums,in_stack_00000008));
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)this,CONCAT44(numSums,in_stack_00000008));
  std::vector<HighsCDouble,_std::allocator<HighsCDouble>_>::resize
            (&this->sumLowerOrig,CONCAT44(numSums,in_stack_00000008));
  std::vector<HighsCDouble,_std::allocator<HighsCDouble>_>::resize
            (&this->sumLowerOrig,CONCAT44(numSums,in_stack_00000008));
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)this,CONCAT44(numSums,in_stack_00000008));
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)this,CONCAT44(numSums,in_stack_00000008));
  std::vector<HighsCDouble,_std::allocator<HighsCDouble>_>::resize
            (&this->sumLowerOrig,CONCAT44(numSums,in_stack_00000008));
  std::vector<HighsCDouble,_std::allocator<HighsCDouble>_>::resize
            (&this->sumLowerOrig,CONCAT44(numSums,in_stack_00000008));
  return;
}

Assistant:

void setNumSums(HighsInt numSums) {
    numInfSumLower.resize(numSums);
    numInfSumUpper.resize(numSums);
    sumLower.resize(numSums);
    sumUpper.resize(numSums);
    numInfSumLowerOrig.resize(numSums);
    numInfSumUpperOrig.resize(numSums);
    sumLowerOrig.resize(numSums);
    sumUpperOrig.resize(numSums);
  }